

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O2

Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> * __thiscall
Inferences::intersectSortedStack<Inferences::AnyNumber<Kernel::MonomFactor>>
          (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *__return_storage_ptr__,
          Inferences *this,Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *l,
          Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *r)

{
  bool bVar1;
  uint uVar2;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *s;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *l_00;
  
  lVar4 = *(long *)(this + 8);
  lVar7 = *(long *)(this + 0x10);
  s = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)this;
  if ((lVar7 != lVar4) && (s = l, l->_cursor != l->_stack)) {
    s = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)this;
    if ((ulong)((long)l->_cursor - (long)l->_stack) < (ulong)(lVar7 - lVar4)) {
      s = l;
    }
    uVar3 = 0;
    uVar2 = 0;
    uVar6 = 0;
    while( true ) {
      if ((ulong)(lVar7 - lVar4 >> 5) <= (ulong)uVar2) break;
      uVar5 = (uint)uVar6;
      if ((ulong)((long)l->_cursor - (long)l->_stack >> 5) <= uVar6) break;
      lVar7 = (ulong)uVar2 * 0x20;
      bVar1 = Lib::operator==((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                               *)(lVar4 + lVar7),
                              &l->_stack[uVar6].
                               super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                             );
      l_00 = (Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
              *)(lVar7 + *(long *)(this + 8));
      if (bVar1) {
        Lib::CoproductImpl::TrivialOperations::CopyCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     *)(s->_stack + uVar3),
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     *)l_00);
        uVar2 = uVar2 + 1;
        uVar3 = uVar3 + 1;
LAB_003c7835:
        uVar5 = uVar5 + 1;
      }
      else {
        bVar1 = Lib::operator<(l_00,&l->_stack[uVar6].
                                     super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              );
        if (!bVar1) goto LAB_003c7835;
        uVar2 = uVar2 + 1;
      }
      uVar6 = (ulong)uVar5;
      lVar4 = *(long *)(this + 8);
      lVar7 = *(long *)(this + 0x10);
    }
    s->_cursor = s->_stack + uVar3;
  }
  Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::Stack(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}